

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.cc
# Opt level: O2

void __thiscall RigidBodyDynamics::Errors::RBDLError::RBDLError(RBDLError *this,string *text)

{
  *(undefined ***)this = &PTR__RBDLError_00278938;
  std::__cxx11::string::string((string *)&this->text,(string *)text);
  return;
}

Assistant:

RBDLError::RBDLError(std::string text): text(text) {}